

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

int Kit_DsdCountLuts_rec(Kit_DsdNtk_t *pNtk,int nLutSize,int Id,int *pCounter)

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  Kit_DsdObj_t *pKVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  if (-1 < Id) {
    uVar1 = pNtk->nVars;
    if ((uint)Id < (uint)pNtk->nNodes + (uint)uVar1) {
      iVar4 = 0;
      if (((uint)uVar1 <= (uint)Id) &&
         (pKVar3 = pNtk->pNodes[(long)Id - (ulong)uVar1], pKVar3 != (Kit_DsdObj_t *)0x0)) {
        KVar2 = *pKVar3;
        uVar6 = (uint)KVar2 >> 6 & 7;
        if (uVar6 - 3 < 2) {
          if (((uint)KVar2 & 0xfc000000) != 0x8000000) {
            __assert_fail("pObj->nFans == 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                          ,0x481,"int Kit_DsdCountLuts_rec(Kit_DsdNtk_t *, int, int, int *)");
          }
          iVar4 = Kit_DsdCountLuts_rec(pNtk,nLutSize,(uint)(*(ushort *)(pKVar3 + 1) >> 1),pCounter);
          iVar5 = Kit_DsdCountLuts_rec
                            (pNtk,nLutSize,(uint)(*(ushort *)&pKVar3[1].field_0x2 >> 1),pCounter);
          if ((iVar4 == 0) && (iVar5 != 0)) {
            iVar4 = iVar5 + -1;
          }
          else if ((iVar4 == 0) || (iVar5 != 0)) {
            *pCounter = *pCounter + 1;
            iVar4 = nLutSize + -2;
          }
          else {
            iVar4 = iVar4 + -1;
          }
        }
        else {
          if (uVar6 != 5) {
            __assert_fail("pObj->Type == KIT_DSD_PRIME",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                          ,0x48b,"int Kit_DsdCountLuts_rec(Kit_DsdNtk_t *, int, int, int *)");
          }
          if (nLutSize < (int)((uint)KVar2 >> 0x1a)) {
            *pCounter = 1000;
            iVar4 = 0;
          }
          else {
            if (0x3ffffff < (uint)KVar2) {
              uVar7 = 0;
              do {
                Kit_DsdCountLuts_rec
                          (pNtk,nLutSize,
                           (uint)(*(ushort *)((long)&pKVar3[1].field_0x0 + uVar7 * 2) >> 1),pCounter
                          );
                uVar7 = uVar7 + 1;
              } while (uVar7 < (uint)*pKVar3 >> 0x1a);
            }
            *pCounter = *pCounter + 1;
            iVar4 = nLutSize - ((uint)*pKVar3 >> 0x1a);
          }
        }
      }
      return iVar4;
    }
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

int Kit_DsdCountLuts_rec( Kit_DsdNtk_t * pNtk, int nLutSize, int Id, int * pCounter )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i, Res0, Res1;
    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
        return 0;
    if ( pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR )
    {
        assert( pObj->nFans == 2 );
        Res0 = Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(pObj->pFans[0]), pCounter );
        Res1 = Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(pObj->pFans[1]), pCounter );
        if ( Res0 == 0 && Res1 > 0 )
            return Res1 - 1;
        if ( Res0 > 0 && Res1 == 0 )
            return Res0 - 1;
        (*pCounter)++;
        return nLutSize - 2;
    }
    assert( pObj->Type == KIT_DSD_PRIME );
    if ( (int)pObj->nFans > nLutSize ) //+ 1 )
    {
        *pCounter = 1000;
        return 0;
    }
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(iLit), pCounter );
    (*pCounter)++;
//    if ( (int)pObj->nFans == nLutSize + 1 )
//        (*pCounter)++;
    return nLutSize - pObj->nFans;
}